

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::ParseTextureNameAndOption(string *texname,texture_option_t *texopt,char *linebuf)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  texture_type_t tVar6;
  real_t *z;
  char **token;
  undefined1 uVar7;
  real_t *y;
  real_t *x;
  byte *pbVar8;
  real_t rVar9;
  double default_x;
  undefined4 in_XMM1_Da;
  uint in_XMM1_Db;
  string local_e8;
  size_type *local_c8;
  string texture_name;
  allocator local_39;
  byte *local_38;
  
  local_c8 = &texture_name._M_string_length;
  texture_name._M_dataplus._M_p = (pointer)0x0;
  texture_name._M_string_length._0_1_ = 0;
  bVar3 = false;
  texture_name.field_2._8_8_ = texname;
LAB_001108b4:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              if (((byte)*linebuf < 0xe) && ((0x2401U >> ((byte)*linebuf & 0x1f) & 1) != 0)) {
                if (bVar3) {
                  std::__cxx11::string::_M_assign((string *)texture_name.field_2._8_8_);
                }
                std::__cxx11::string::~string((string *)&local_c8);
                return bVar3;
              }
              sVar5 = strspn(linebuf," \t");
              pbVar8 = (byte *)linebuf + sVar5;
              uVar7 = 0x73;
              local_38 = pbVar8;
              iVar4 = strncmp((char *)pbVar8,"-blendu",7);
              if ((iVar4 != 0) || ((pbVar8[7] != 0x20 && (pbVar8[7] != 9)))) break;
              local_38 = pbVar8 + 8;
              bVar2 = parseOnOff((char **)&local_38,(bool)uVar7);
              texopt->blendu = bVar2;
              linebuf = (char *)local_38;
            }
            uVar7 = 0x7b;
            iVar4 = strncmp((char *)pbVar8,"-blendv",7);
            if ((iVar4 != 0) || ((pbVar8[7] != 0x20 && (pbVar8[7] != 9)))) break;
            local_38 = pbVar8 + 8;
            bVar2 = parseOnOff((char **)&local_38,(bool)uVar7);
            texopt->blendv = bVar2;
            linebuf = (char *)local_38;
          }
          uVar7 = 0x83;
          iVar4 = strncmp((char *)pbVar8,"-clamp",6);
          if ((iVar4 != 0) || ((pbVar8[6] != 0x20 && (pbVar8[6] != 9)))) break;
          local_38 = pbVar8 + 7;
          bVar2 = parseOnOff((char **)&local_38,(bool)uVar7);
          texopt->clamp = bVar2;
          linebuf = (char *)local_38;
        }
        iVar4 = strncmp((char *)pbVar8,"-boost",6);
        if ((iVar4 != 0) || ((pbVar8[6] != 0x20 && (pbVar8[6] != 9)))) break;
        local_38 = pbVar8 + 7;
        rVar9 = parseReal((char **)&local_38,1.0);
        texopt->sharpness = rVar9;
        linebuf = (char *)local_38;
      }
      bVar1 = *pbVar8;
      if (bVar1 == 0x2d) break;
LAB_00110b1e:
      iVar4 = strncmp((char *)pbVar8,"-type",5);
      if ((iVar4 == 0) && ((pbVar8[5] == 0x20 || (pbVar8[5] == 9)))) {
        pbVar8 = pbVar8 + 5;
        local_38 = pbVar8;
        sVar5 = strspn((char *)pbVar8," \t");
        pbVar8 = pbVar8 + sVar5;
        local_38 = pbVar8;
        sVar5 = strcspn((char *)pbVar8," \t\r");
        iVar4 = strncmp((char *)pbVar8,"cube_top",8);
        tVar6 = TEXTURE_TYPE_CUBE_TOP;
        if (iVar4 != 0) {
          iVar4 = strncmp((char *)pbVar8,"cube_bottom",0xb);
          tVar6 = TEXTURE_TYPE_CUBE_BOTTOM;
          if (iVar4 != 0) {
            iVar4 = strncmp((char *)pbVar8,"cube_left",9);
            tVar6 = TEXTURE_TYPE_CUBE_LEFT;
            if (iVar4 != 0) {
              iVar4 = strncmp((char *)pbVar8,"cube_right",10);
              tVar6 = TEXTURE_TYPE_CUBE_RIGHT;
              if (iVar4 != 0) {
                iVar4 = strncmp((char *)pbVar8,"cube_front",10);
                tVar6 = TEXTURE_TYPE_CUBE_FRONT;
                if (iVar4 != 0) {
                  iVar4 = strncmp((char *)pbVar8,"cube_back",9);
                  tVar6 = TEXTURE_TYPE_CUBE_BACK;
                  if (iVar4 != 0) {
                    iVar4 = strncmp((char *)pbVar8,"sphere",6);
                    tVar6 = (texture_type_t)(iVar4 == 0);
                  }
                }
              }
            }
          }
        }
        linebuf = (char *)(pbVar8 + sVar5);
        texopt->type = tVar6;
        local_38 = (byte *)linebuf;
      }
      else {
        iVar4 = strncmp((char *)pbVar8,"-texres",7);
        if ((iVar4 == 0) && ((pbVar8[7] == 0x20 || (pbVar8[7] == 9)))) {
          local_38 = pbVar8 + 7;
          iVar4 = parseInt((char **)&local_38);
          texopt->texture_resolution = iVar4;
          linebuf = (char *)local_38;
        }
        else {
          iVar4 = strncmp((char *)pbVar8,"-imfchan",8);
          if ((iVar4 == 0) && ((pbVar8[8] == 0x20 || (pbVar8[8] == 9)))) {
            local_38 = pbVar8 + 9;
            sVar5 = strspn((char *)local_38," \t");
            pbVar8 = pbVar8 + sVar5 + 9;
            local_38 = pbVar8;
            sVar5 = strcspn((char *)pbVar8," \t\r");
            if (sVar5 == 1) {
              texopt->imfchan = *pbVar8;
            }
            linebuf = (char *)(pbVar8 + sVar5);
            local_38 = (byte *)linebuf;
          }
          else if ((bVar1 == 0x2d) &&
                  (((pbVar8[1] == 0x6d && (pbVar8[2] == 0x6d)) &&
                   ((pbVar8[3] == 0x20 || (pbVar8[3] == 9)))))) {
            local_38 = pbVar8 + 4;
            parseReal2(&texopt->brightness,&texopt->contrast,(char **)&local_38,1.0,
                       (double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
            linebuf = (char *)local_38;
          }
          else {
            iVar4 = strncmp((char *)pbVar8,"-colorspace",0xb);
            if ((iVar4 == 0) && ((pbVar8[0xb] == 0x20 || (pbVar8[0xb] == 9)))) {
              local_38 = pbVar8 + 0xc;
              parseString_abi_cxx11_(&local_e8,(tinyobj *)&local_38,token);
              std::__cxx11::string::operator=((string *)&texopt->colorspace,(string *)&local_e8);
              std::__cxx11::string::~string((string *)&local_e8);
              linebuf = (char *)local_38;
            }
            else {
              std::__cxx11::string::string((string *)&local_e8,(char *)pbVar8,&local_39);
              std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_e8);
              std::__cxx11::string::~string((string *)&local_e8);
              linebuf = (char *)(pbVar8 + (long)texture_name._M_dataplus._M_p);
              bVar3 = true;
              local_38 = (byte *)linebuf;
            }
          }
        }
      }
    }
    if (((pbVar8[1] == 0x62) && (pbVar8[2] == 0x6d)) && ((pbVar8[3] == 0x20 || (pbVar8[3] == 9)))) {
      local_38 = pbVar8 + 4;
      rVar9 = parseReal((char **)&local_38,1.0);
      texopt->bump_multiplier = rVar9;
      linebuf = (char *)local_38;
      goto LAB_001108b4;
    }
    if ((pbVar8[1] == 0x6f) &&
       ((z = texopt->origin_offset + 2, y = texopt->origin_offset + 1, x = texopt->origin_offset,
        pbVar8[2] == 0x20 || (pbVar8[2] == 9)))) {
LAB_00110b10:
      in_XMM1_Db = 0;
      default_x = 0.0;
    }
    else {
      if ((pbVar8[1] != 0x73) || ((pbVar8[2] != 0x20 && (pbVar8[2] != 9)))) {
        if ((pbVar8[1] != 0x74) ||
           ((z = texopt->turbulence + 2, y = texopt->turbulence + 1, x = texopt->turbulence,
            pbVar8[2] != 0x20 && (pbVar8[2] != 9)))) goto LAB_00110b1e;
        goto LAB_00110b10;
      }
      default_x = 1.0;
      in_XMM1_Db = 0x3ff00000;
      z = texopt->scale + 2;
      y = texopt->scale + 1;
      x = texopt->scale;
    }
    local_38 = pbVar8 + 3;
    in_XMM1_Da = 0;
    parseReal3(x,y,z,(char **)&local_38,default_x,(double)((ulong)in_XMM1_Db << 0x20),
               (double)((ulong)in_XMM1_Db << 0x20));
    linebuf = (char *)local_38;
  } while( true );
}

Assistant:

bool ParseTextureNameAndOption(std::string *texname, texture_option_t *texopt,
                               const char *linebuf) {
  // @todo { write more robust lexer and parser. }
  bool found_texname = false;
  std::string texture_name;

  const char *token = linebuf;  // Assume line ends with NULL

  while (!IS_NEW_LINE((*token))) {
    token += strspn(token, " \t");  // skip space
    if ((0 == strncmp(token, "-blendu", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendu = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-blendv", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendv = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-clamp", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->clamp = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-boost", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->sharpness = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-bm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      texopt->bump_multiplier = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-o", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->origin_offset[0]), &(texopt->origin_offset[1]),
                 &(texopt->origin_offset[2]), &token);
    } else if ((0 == strncmp(token, "-s", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->scale[0]), &(texopt->scale[1]), &(texopt->scale[2]),
                 &token, 1.0, 1.0, 1.0);
    } else if ((0 == strncmp(token, "-t", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->turbulence[0]), &(texopt->turbulence[1]),
                 &(texopt->turbulence[2]), &token);
    } else if ((0 == strncmp(token, "-type", 5)) && IS_SPACE((token[5]))) {
      token += 5;
      texopt->type = parseTextureType((&token), TEXTURE_TYPE_NONE);
    } else if ((0 == strncmp(token, "-texres", 7)) && IS_SPACE((token[7]))) {
      token += 7;
      // TODO(syoyo): Check if arg is int type.
      texopt->texture_resolution = parseInt(&token);
    } else if ((0 == strncmp(token, "-imfchan", 8)) && IS_SPACE((token[8]))) {
      token += 9;
      token += strspn(token, " \t");
      const char *end = token + strcspn(token, " \t\r");
      if ((end - token) == 1) {  // Assume one char for -imfchan
        texopt->imfchan = (*token);
      }
      token = end;
    } else if ((0 == strncmp(token, "-mm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      parseReal2(&(texopt->brightness), &(texopt->contrast), &token, 0.0, 1.0);
    } else if ((0 == strncmp(token, "-colorspace", 11)) &&
               IS_SPACE((token[11]))) {
      token += 12;
      texopt->colorspace = parseString(&token);
    } else {
// Assume texture filename
#if 0
      size_t len = strcspn(token, " \t\r");  // untile next space
      texture_name = std::string(token, token + len);
      token += len;

      token += strspn(token, " \t");  // skip space
#else
      // Read filename until line end to parse filename containing whitespace
      // TODO(syoyo): Support parsing texture option flag after the filename.
      texture_name = std::string(token);
      token += texture_name.length();
#endif

      found_texname = true;
    }
  }

  if (found_texname) {
    (*texname) = texture_name;
    return true;
  } else {
    return false;
  }
}